

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UChar * icu_63::TimeZone::findID(UnicodeString *id)

{
  int32_t indexS;
  UResourceBundle *resB;
  UResourceBundle *array;
  UChar *pUVar1;
  UErrorCode ec;
  UErrorCode local_2c;
  
  local_2c = U_ZERO_ERROR;
  resB = ures_openDirect_63((char *)0x0,"zoneinfo64",&local_2c);
  array = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,&local_2c);
  indexS = findInStringArray(array,id,&local_2c);
  pUVar1 = ures_getStringByIndex_63(array,indexS,(int32_t *)0x0,&local_2c);
  if (U_ZERO_ERROR < local_2c) {
    pUVar1 = (UChar *)0x0;
  }
  ures_close_63(array);
  ures_close_63(resB);
  return pUVar1;
}

Assistant:

const UChar*
TimeZone::findID(const UnicodeString& id) {
    const UChar *result = NULL;
    UErrorCode ec = U_ZERO_ERROR;
    UResourceBundle *rb = ures_openDirect(NULL, kZONEINFO, &ec);

    // resolve zone index by name
    UResourceBundle *names = ures_getByKey(rb, kNAMES, NULL, &ec);
    int32_t idx = findInStringArray(names, id, ec);
    result = ures_getStringByIndex(names, idx, NULL, &ec);
    if (U_FAILURE(ec)) {
        result = NULL;
    }
    ures_close(names);
    ures_close(rb);
    return result;
}